

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O3

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set,size_t num_sent)

{
  quicly_local_cid_t *pqVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  en_quicly_local_cid_state_t eVar13;
  undefined4 uVar14;
  en_quicly_local_cid_state_t eVar15;
  undefined4 uVar16;
  quicly_local_cid_t *pqVar17;
  size_t sVar18;
  
  uVar2 = set->_size;
  if (uVar2 < num_sent) {
    __assert_fail("num_sent <= set->_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                  ,0x84,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
  }
  if (num_sent != 0) {
    pqVar17 = set->cids;
    sVar18 = num_sent;
    do {
      if (pqVar17->state != QUICLY_LOCAL_CID_STATE_PENDING) {
        __assert_fail("set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/local_cid.c"
                      ,0x88,"void quicly_local_cid_on_sent(quicly_local_cid_set_t *, size_t)");
      }
      pqVar17->state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
      pqVar17 = pqVar17 + 1;
      sVar18 = sVar18 - 1;
    } while (sVar18 != 0);
  }
  if (num_sent < uVar2) {
    pqVar17 = set->cids;
    sVar18 = num_sent;
    do {
      if (pqVar17[num_sent].state != QUICLY_LOCAL_CID_STATE_PENDING) {
        return;
      }
      pqVar1 = pqVar17 + num_sent;
      uVar3 = *(undefined8 *)(pqVar17->stateless_reset_token + 0xb);
      eVar15 = pqVar17->state;
      uVar16 = *(undefined4 *)&pqVar17->field_0x4;
      uVar4 = pqVar17->sequence;
      uVar5 = *(undefined8 *)(pqVar17->cid).cid;
      uVar6 = *(undefined8 *)((pqVar17->cid).cid + 8);
      uVar7 = *(undefined8 *)((pqVar17->cid).cid + 0x10);
      uVar8 = *(undefined8 *)(pqVar17->stateless_reset_token + 3);
      *(undefined8 *)(pqVar17->stateless_reset_token + 0xb) =
           *(undefined8 *)(pqVar1->stateless_reset_token + 0xb);
      eVar13 = pqVar1->state;
      uVar14 = *(undefined4 *)&pqVar1->field_0x4;
      uVar9 = pqVar1->sequence;
      uVar10 = *(undefined8 *)(pqVar1->cid).cid;
      uVar11 = *(undefined8 *)((pqVar1->cid).cid + 8);
      uVar12 = *(undefined8 *)(pqVar1->stateless_reset_token + 3);
      *(undefined8 *)((pqVar17->cid).cid + 0x10) = *(undefined8 *)((pqVar1->cid).cid + 0x10);
      *(undefined8 *)(pqVar17->stateless_reset_token + 3) = uVar12;
      *(undefined8 *)(pqVar17->cid).cid = uVar10;
      *(undefined8 *)((pqVar17->cid).cid + 8) = uVar11;
      pqVar17->state = eVar13;
      *(undefined4 *)&pqVar17->field_0x4 = uVar14;
      pqVar17->sequence = uVar9;
      *(undefined8 *)(pqVar1->stateless_reset_token + 0xb) = uVar3;
      *(undefined8 *)((pqVar1->cid).cid + 0x10) = uVar7;
      *(undefined8 *)(pqVar1->stateless_reset_token + 3) = uVar8;
      *(undefined8 *)(pqVar1->cid).cid = uVar5;
      *(undefined8 *)((pqVar1->cid).cid + 8) = uVar6;
      pqVar1->state = eVar15;
      *(undefined4 *)&pqVar1->field_0x4 = uVar16;
      pqVar1->sequence = uVar4;
      sVar18 = sVar18 + 1;
      pqVar17 = pqVar17 + 1;
    } while (sVar18 < set->_size);
  }
  return;
}

Assistant:

void quicly_local_cid_on_sent(quicly_local_cid_set_t *set, size_t num_sent)
{
    assert(num_sent <= set->_size);

    /* first, mark the first `num_sent` CIDs as INFLIGHT */
    for (size_t i = 0; i < num_sent; i++) {
        assert(set->cids[i].state == QUICLY_LOCAL_CID_STATE_PENDING);
        set->cids[i].state = QUICLY_LOCAL_CID_STATE_INFLIGHT;
    }

    /* then move the remaining PENDING CIDs (if any) to the front of the array */
    for (size_t i = num_sent; i < set->_size; i++) {
        if (set->cids[i].state != QUICLY_LOCAL_CID_STATE_PENDING)
            break;
        swap_cids(&set->cids[i], &set->cids[i - num_sent]);
    }
}